

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bcon-basic.c
# Opt level: O1

void test_inline_nested(void)

{
  char extraout_AL;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  void *pvVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 *puVar11;
  ulong uVar12;
  undefined8 extraout_RAX;
  uint extraout_EDX;
  uint32_t uVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  char *pcVar17;
  undefined1 *puVar18;
  undefined1 *puVar19;
  bson_t *pbVar20;
  undefined8 extraout_XMM1_Qa;
  undefined8 uVar21;
  bson_t expected;
  bson_t bcon;
  bson_t third;
  bson_t bar;
  bson_t foo;
  undefined8 uStack_7450;
  uint8_t *puStack_7448;
  undefined1 *puStack_7440;
  undefined1 auStack_7430 [8];
  void *pvStack_7428;
  undefined8 uStack_7418;
  undefined8 uStack_7410;
  char *pcStack_7408;
  undefined8 uStack_73f0;
  undefined1 auStack_7380 [25944];
  void *pvStack_e28;
  char *pcStack_e20;
  char *pcStack_e18;
  char *pcStack_e10;
  code *pcStack_e08;
  bson_t bStack_e00;
  undefined1 auStack_d80 [4];
  uint uStack_d7c;
  undefined1 auStack_d00 [336];
  void *pvStack_bb0;
  ulong uStack_ba8;
  undefined1 *puStack_ba0;
  ulong uStack_b98;
  void *pvStack_b90;
  code *pcStack_b88;
  undefined1 auStack_b80 [4];
  uint uStack_b7c;
  void *pvStack_a30;
  undefined1 *puStack_a28;
  ulong uStack_a20;
  void *pvStack_a18;
  ulong uStack_a10;
  code *apcStack_a08 [16];
  undefined8 uStack_988;
  undefined1 auStack_980 [4];
  uint uStack_97c;
  undefined1 auStack_900 [4];
  uint uStack_8fc;
  undefined1 auStack_880 [336];
  void *pvStack_730;
  undefined1 *puStack_728;
  undefined1 *puStack_720;
  char *pcStack_718;
  char *pcStack_710;
  code *apcStack_708 [16];
  undefined8 uStack_688;
  undefined1 auStack_680 [4];
  uint uStack_67c;
  undefined1 auStack_600 [4];
  uint uStack_5fc;
  undefined1 auStack_580 [128];
  undefined1 auStack_500 [280];
  undefined8 uStack_3e8;
  undefined8 uStack_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 uStack_3c0;
  char *pcStack_3b8;
  char *pcStack_3b0;
  char *pcStack_3a8;
  char *pcStack_3a0;
  char *pcStack_398;
  char *pcStack_390;
  code *pcStack_388;
  undefined1 auStack_380 [4];
  uint local_37c;
  undefined1 local_300 [4];
  uint local_2fc;
  undefined1 local_280 [128];
  undefined1 local_200 [128];
  undefined1 local_180 [336];
  
  puVar19 = auStack_380;
  pcStack_388 = (code *)0x13a201;
  bson_init(local_300);
  pcStack_388 = (code *)0x13a20c;
  bson_init(auStack_380);
  pcStack_388 = (code *)0x13a21c;
  bson_init(local_180);
  pcStack_388 = (code *)0x13a22c;
  bson_init(local_200);
  pcStack_388 = (code *)0x13a23c;
  bson_init(local_280);
  pcStack_388 = (code *)0x13a25d;
  bson_append_utf8(local_280,"hello",0xffffffff,"world",0xffffffff);
  pcStack_388 = (code *)0x13a276;
  bson_append_int32(local_200,"0",0xffffffff,1);
  pcStack_388 = (code *)0x13a28f;
  bson_append_int32(local_200,"1",0xffffffff,2);
  pcStack_388 = (code *)0x13a2a6;
  bson_append_document(local_200,"2",0xffffffff,local_280);
  pcStack_388 = (code *)0x13a2c0;
  bson_append_array(local_180,"bar",0xffffffff,local_200);
  pcStack_388 = (code *)0x13a2da;
  bson_append_document(auStack_380,"foo",0xffffffff,local_180);
  pcStack_388 = (code *)0x13a2df;
  uStack_3d0 = bson_bcon_magic();
  pcStack_388 = (code *)0x0;
  pcStack_390 = "}";
  pcStack_398 = "]";
  pcStack_3a0 = "}";
  pcStack_3a8 = "world";
  pcStack_3b0 = "hello";
  pcStack_3b8 = "{";
  uStack_3c0 = 2;
  uStack_3c8 = 0xf;
  uStack_3d8 = 1;
  uStack_3e0 = 0xf;
  uStack_3e8 = 0x13a339;
  bcon_append(local_300,"foo","{","bar","[");
  pcStack_388 = (code *)0x13a345;
  pvVar5 = (void *)bson_get_data(local_300);
  pcStack_388 = (code *)0x13a350;
  pvVar6 = (void *)bson_get_data(auStack_380);
  if (local_37c == local_2fc) {
    pcStack_388 = (code *)0x13a369;
    pvVar7 = (void *)bson_get_data(auStack_380);
    pcStack_388 = (code *)0x13a379;
    pvVar8 = (void *)bson_get_data(local_300);
    pcStack_388 = (code *)0x13a388;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)local_37c);
    if (iVar1 == 0) {
      pcStack_388 = (code *)0x13a399;
      bson_destroy(local_300);
      pcStack_388 = (code *)0x13a3a1;
      bson_destroy(auStack_380);
      pcStack_388 = (code *)0x13a3ae;
      bson_destroy(local_180);
      pcStack_388 = (code *)0x13a3bb;
      bson_destroy(local_200);
      pcStack_388 = (code *)0x13a3c8;
      bson_destroy(local_280);
      return;
    }
  }
  puVar18 = local_300;
  pcStack_388 = (code *)0x13a3e9;
  uVar9 = bson_as_canonical_extended_json(puVar18,0);
  pcStack_388 = (code *)0x13a3f9;
  uVar10 = bson_as_canonical_extended_json(auStack_380,0);
  uVar2 = local_37c;
  if (local_2fc < local_37c) {
    uVar2 = local_2fc;
  }
  if (uVar2 != 0) {
    uVar2 = local_37c;
    if (local_2fc <= local_37c) {
      uVar2 = local_2fc;
    }
    lVar14 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar14) != *(char *)((long)pvVar6 + lVar14)) {
        uVar2 = (uint)lVar14;
        goto LAB_0013a432;
      }
      lVar14 = lVar14 + 1;
    } while (uVar2 != (uint)lVar14);
  }
  uVar2 = 0xffffffff;
LAB_0013a432:
  uVar3 = local_2fc;
  if (local_2fc < local_37c) {
    uVar3 = local_37c;
  }
  uVar3 = uVar3 - 1;
  if (uVar2 != 0xffffffff) {
    uVar3 = uVar2;
  }
  pcStack_388 = (code *)0x13a45d;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3,uVar9,uVar10);
  pcStack_388 = (code *)0x13a475;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_388 = (code *)0x13a490;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013a4dc:
    pcStack_388 = (code *)0x13a4e1;
    test_inline_nested_cold_5();
LAB_0013a4e1:
    pcStack_388 = (code *)0x13a4e6;
    test_inline_nested_cold_4();
LAB_0013a4e6:
    pcStack_388 = (code *)0x13a4eb;
    test_inline_nested_cold_1();
  }
  else {
    puVar18 = (undefined1 *)(ulong)uVar3;
    puVar19 = auStack_380;
    if (uVar3 == 0xffffffff) goto LAB_0013a4e1;
    puVar19 = (undefined1 *)(ulong)local_2fc;
    pcStack_388 = (code *)0x13a4b4;
    puVar11 = (undefined1 *)write(uVar2,pvVar5,(size_t)puVar19);
    if (puVar11 != puVar19) goto LAB_0013a4e6;
    pvVar5 = (void *)(ulong)local_37c;
    pcStack_388 = (code *)0x13a4cc;
    pvVar7 = (void *)write(uVar3,pvVar6,(size_t)pvVar5);
    if (pvVar7 == pvVar5) {
      pcStack_388 = (code *)0x13a4dc;
      test_inline_nested_cold_3();
      goto LAB_0013a4dc;
    }
  }
  pcStack_388 = test_concat;
  test_inline_nested_cold_2();
  apcStack_708[0] = (code *)0x13a518;
  pcStack_3b0 = (char *)pvVar6;
  pcStack_3a8 = puVar18;
  pcStack_3a0 = puVar19;
  pcStack_398 = (char *)pvVar5;
  pcStack_390 = (char *)(ulong)uVar2;
  pcStack_388 = (code *)&stack0xfffffffffffffff8;
  bson_init(auStack_680);
  apcStack_708[0] = (code *)0x13a528;
  bson_init(auStack_600);
  apcStack_708[0] = (code *)0x13a538;
  bson_init(auStack_500);
  apcStack_708[0] = (code *)0x13a545;
  bson_init(auStack_580);
  puVar19 = (undefined1 *)0xffffffff;
  apcStack_708[0] = (code *)0x13a56c;
  bson_append_utf8(auStack_500,"hello",0xffffffff,"world",0xffffffff);
  apcStack_708[0] = (code *)0x13a586;
  bson_append_document(auStack_600,"foo",0xffffffff,auStack_500);
  apcStack_708[0] = (code *)0x13a58b;
  uStack_688 = bson_bcon_magic();
  apcStack_708[0] = (code *)0x0;
  pcStack_710 = "}";
  pcStack_718 = (char *)0x13a5bb;
  bcon_append(auStack_680,"foo","{",uStack_688,0x15,auStack_500);
  apcStack_708[0] = (code *)0x13a5c7;
  pvVar5 = (void *)bson_get_data(auStack_680);
  apcStack_708[0] = (code *)0x13a5d2;
  pvVar6 = (void *)bson_get_data(auStack_600);
  if (uStack_5fc == uStack_67c) {
    apcStack_708[0] = (code *)0x13a5f3;
    pvVar7 = (void *)bson_get_data(auStack_600);
    apcStack_708[0] = (code *)0x13a603;
    pvVar8 = (void *)bson_get_data(auStack_680);
    apcStack_708[0] = (code *)0x13a612;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_5fc);
    if (iVar1 != 0) goto LAB_0013a7b2;
    apcStack_708[0] = (code *)0x13a627;
    bson_reinit(auStack_680);
    apcStack_708[0] = (code *)0x13a637;
    bson_reinit(auStack_600);
    apcStack_708[0] = (code *)0x13a647;
    bson_reinit(auStack_500);
    apcStack_708[0] = (code *)0x13a66b;
    bson_append_utf8(auStack_500,"0",0xffffffff,"bar",0xffffffff);
    apcStack_708[0] = (code *)0x13a68f;
    bson_append_utf8(auStack_500,"1",0xffffffff,"baz",0xffffffff);
    apcStack_708[0] = (code *)0x13a6a9;
    bson_append_array(auStack_600,"foo",0xffffffff,auStack_500);
    apcStack_708[0] = (code *)0x13a6ca;
    bson_append_utf8(auStack_580,"0",0xffffffff,"baz",0xffffffff);
    pcStack_710 = (char *)0x0;
    pcStack_718 = "]";
    puStack_728 = (undefined1 *)0x13a70c;
    puStack_720 = auStack_580;
    bcon_append(auStack_680,"foo","[","bar",uStack_688,0x15);
    apcStack_708[0] = (code *)0x13a71b;
    pvVar5 = (void *)bson_get_data(auStack_680);
    apcStack_708[0] = (code *)0x13a726;
    pvVar6 = (void *)bson_get_data(auStack_600);
    if (uStack_5fc == uStack_67c) {
      apcStack_708[0] = (code *)0x13a748;
      pvVar7 = (void *)bson_get_data(auStack_600);
      apcStack_708[0] = (code *)0x13a758;
      pvVar8 = (void *)bson_get_data(auStack_680);
      apcStack_708[0] = (code *)0x13a767;
      iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_5fc);
      if (iVar1 == 0) {
        apcStack_708[0] = (code *)0x13a77c;
        bson_destroy(auStack_680);
        apcStack_708[0] = (code *)0x13a789;
        bson_destroy(auStack_500);
        apcStack_708[0] = (code *)0x13a796;
        bson_destroy(auStack_580);
        apcStack_708[0] = (code *)0x13a7a3;
        bson_destroy(auStack_600);
        return;
      }
    }
    puVar19 = auStack_680;
    apcStack_708[0] = (code *)0x13a80c;
    uVar12 = bson_as_canonical_extended_json(puVar19,0);
    puVar18 = auStack_600;
    apcStack_708[0] = (code *)0x13a821;
    uVar9 = bson_as_canonical_extended_json(puVar18,0);
    uVar4 = uStack_5fc;
    if (uStack_67c < uStack_5fc) {
      uVar4 = uStack_67c;
    }
    uVar2 = uStack_5fc;
    uVar3 = uStack_67c;
    if (uVar4 != 0) {
      uVar4 = uStack_5fc;
      if (uStack_67c <= uStack_5fc) {
        uVar4 = uStack_67c;
      }
      uVar15 = 0;
      do {
        if (*(char *)((long)pvVar5 + uVar15) != *(char *)((long)pvVar6 + uVar15)) goto LAB_0013a944;
        uVar15 = uVar15 + 1;
      } while (uVar4 != (uint)uVar15);
    }
    uVar4 = 0xffffffff;
LAB_0013a946:
    if (uVar3 < uVar2) {
      uVar3 = uVar2;
    }
    uVar2 = uVar3 - 1;
    if (uVar4 != 0xffffffff) {
      uVar2 = uVar4;
    }
    apcStack_708[0] = (code *)0x13a971;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar2,uVar12,uVar9);
    apcStack_708[0] = (code *)0x13a989;
    uVar2 = open("failure.bad.bson",0x42,0x1a0);
    uVar12 = (ulong)uVar2;
    apcStack_708[0] = (code *)0x13a9a4;
    uVar3 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar2 == 0xffffffff) goto LAB_0013aa07;
    puVar19 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013aa0c;
    puVar18 = (undefined1 *)(ulong)uStack_67c;
    apcStack_708[0] = (code *)0x13a9c8;
    puVar11 = (undefined1 *)write(uVar2,pvVar5,(size_t)puVar18);
    if (puVar11 != puVar18) goto LAB_0013aa11;
    pvVar5 = (void *)(ulong)uStack_5fc;
    apcStack_708[0] = (code *)0x13a9e3;
    pvVar7 = (void *)write(uVar3,pvVar6,(size_t)pvVar5);
    if (pvVar7 == pvVar5) {
      apcStack_708[0] = (code *)0x13a9f3;
      test_concat_cold_8();
      goto LAB_0013a9f3;
    }
  }
  else {
LAB_0013a7b2:
    apcStack_708[0] = (code *)0x13a7c4;
    uStack_688 = bson_as_canonical_extended_json(auStack_680,0);
    puVar18 = auStack_600;
    apcStack_708[0] = (code *)0x13a7db;
    uVar9 = bson_as_canonical_extended_json(puVar18,0);
    uVar2 = uStack_5fc;
    if (uStack_67c < uStack_5fc) {
      uVar2 = uStack_67c;
    }
    if (uVar2 != 0) {
      uVar2 = uStack_5fc;
      if (uStack_67c <= uStack_5fc) {
        uVar2 = uStack_67c;
      }
      uVar12 = 0;
      do {
        if (*(char *)((long)pvVar5 + uVar12) != *(char *)((long)pvVar6 + uVar12)) {
          puVar19 = (undefined1 *)(uVar12 & 0xffffffff);
          break;
        }
        uVar12 = uVar12 + 1;
      } while (uVar2 != (uint)uVar12);
    }
    uVar2 = uStack_67c;
    if (uStack_67c < uStack_5fc) {
      uVar2 = uStack_5fc;
    }
    puVar11 = (undefined1 *)(ulong)(uVar2 - 1);
    if ((int)puVar19 != -1) {
      puVar11 = puVar19;
    }
    apcStack_708[0] = (code *)0x13a8b2;
    uVar10 = uStack_688;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",puVar11,uStack_688,uVar9);
    uVar2 = (uint)uVar10;
    apcStack_708[0] = (code *)0x13a8ca;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    uVar12 = (ulong)uVar3;
    apcStack_708[0] = (code *)0x13a8e5;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    if (uVar3 == 0xffffffff) {
LAB_0013a9f3:
      apcStack_708[0] = (code *)0x13a9f8;
      test_concat_cold_5();
LAB_0013a9f8:
      apcStack_708[0] = (code *)0x13a9fd;
      test_concat_cold_4();
LAB_0013a9fd:
      apcStack_708[0] = (code *)0x13aa02;
      test_concat_cold_1();
    }
    else {
      puVar19 = (undefined1 *)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013a9f8;
      puVar18 = (undefined1 *)(ulong)uStack_67c;
      apcStack_708[0] = (code *)0x13a911;
      puVar11 = (undefined1 *)write(uVar3,pvVar5,(size_t)puVar18);
      if (puVar11 != puVar18) goto LAB_0013a9fd;
      pvVar5 = (void *)(ulong)uStack_5fc;
      apcStack_708[0] = (code *)0x13a930;
      pvVar7 = (void *)write(uVar4,pvVar6,(size_t)pvVar5);
      if (pvVar7 == pvVar5) {
        apcStack_708[0] = (code *)0x13a944;
        uVar15 = uVar12;
        test_concat_cold_3();
        uVar9 = extraout_RAX;
        uVar3 = extraout_EDX;
LAB_0013a944:
        uVar4 = (uint)uVar15;
        goto LAB_0013a946;
      }
    }
    apcStack_708[0] = (code *)0x13aa07;
    test_concat_cold_2();
LAB_0013aa07:
    apcStack_708[0] = (code *)0x13aa0c;
    test_concat_cold_10();
LAB_0013aa0c:
    apcStack_708[0] = (code *)0x13aa11;
    test_concat_cold_9();
LAB_0013aa11:
    apcStack_708[0] = (code *)0x13aa16;
    test_concat_cold_6();
  }
  apcStack_708[0] = test_iter;
  test_concat_cold_7();
  apcStack_a08[0] = (code *)0x13aa43;
  pvStack_730 = pvVar6;
  puStack_728 = puVar19;
  puStack_720 = puVar18;
  pcStack_718 = (char *)pvVar5;
  pcStack_710 = (char *)uVar12;
  apcStack_708[0] = (code *)&pcStack_388;
  bson_init(auStack_900);
  apcStack_a08[0] = (code *)0x13aa53;
  bson_init(auStack_980);
  uVar12 = 0xffffffff;
  apcStack_a08[0] = (code *)0x13aa75;
  bson_append_int32(auStack_980,"foo",0xffffffff,100);
  apcStack_a08[0] = (code *)0x13aa8b;
  bson_iter_init_find(auStack_880,auStack_980,"foo");
  apcStack_a08[0] = (code *)0x13aa90;
  uVar9 = bson_bcon_magic();
  apcStack_a08[0] = (code *)0x13aaab;
  bcon_append(auStack_900,"foo",uVar9,0x1d,auStack_880,0);
  apcStack_a08[0] = (code *)0x13aab3;
  pvVar5 = (void *)bson_get_data(auStack_900);
  apcStack_a08[0] = (code *)0x13aabe;
  pvVar6 = (void *)bson_get_data(auStack_980);
  if (uStack_97c == uStack_8fc) {
    apcStack_a08[0] = (code *)0x13aadc;
    pvVar7 = (void *)bson_get_data(auStack_980);
    apcStack_a08[0] = (code *)0x13aaec;
    pvVar8 = (void *)bson_get_data(auStack_900);
    apcStack_a08[0] = (code *)0x13aafb;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_97c);
    if (iVar1 == 0) {
      apcStack_a08[0] = (code *)0x13ab0c;
      bson_destroy(auStack_900);
      apcStack_a08[0] = (code *)0x13ab19;
      bson_destroy(auStack_980);
      return;
    }
  }
  puVar19 = auStack_900;
  apcStack_a08[0] = (code *)0x13ab3a;
  uStack_988 = bson_as_canonical_extended_json(puVar19,0);
  apcStack_a08[0] = (code *)0x13ab51;
  uVar9 = bson_as_canonical_extended_json(auStack_980,0);
  uVar2 = uStack_97c;
  if (uStack_8fc < uStack_97c) {
    uVar2 = uStack_8fc;
  }
  if (uVar2 != 0) {
    uVar2 = uStack_97c;
    if (uStack_8fc <= uStack_97c) {
      uVar2 = uStack_8fc;
    }
    uVar15 = 0;
    do {
      if (*(char *)((long)pvVar5 + uVar15) != *(char *)((long)pvVar6 + uVar15)) {
        uVar12 = uVar15 & 0xffffffff;
        break;
      }
      uVar15 = uVar15 + 1;
    } while (uVar2 != (uint)uVar15);
  }
  uVar2 = uStack_8fc;
  if (uStack_8fc < uStack_97c) {
    uVar2 = uStack_97c;
  }
  uVar15 = (ulong)(uVar2 - 1);
  if ((int)uVar12 != -1) {
    uVar15 = uVar12;
  }
  apcStack_a08[0] = (code *)0x13abc1;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar15,uStack_988,uVar9);
  apcStack_a08[0] = (code *)0x13abd9;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  apcStack_a08[0] = (code *)0x13abf4;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013ac43:
    apcStack_a08[0] = (code *)0x13ac48;
    test_iter_cold_5();
LAB_0013ac48:
    apcStack_a08[0] = (code *)0x13ac4d;
    test_iter_cold_4();
LAB_0013ac4d:
    apcStack_a08[0] = (code *)0x13ac52;
    test_iter_cold_1();
  }
  else {
    puVar19 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013ac48;
    uVar12 = (ulong)uStack_8fc;
    apcStack_a08[0] = (code *)0x13ac18;
    uVar15 = write(uVar2,pvVar5,uVar12);
    if (uVar15 != uVar12) goto LAB_0013ac4d;
    pvVar5 = (void *)(ulong)uStack_97c;
    apcStack_a08[0] = (code *)0x13ac33;
    pvVar7 = (void *)write(uVar3,pvVar6,(size_t)pvVar5);
    if (pvVar7 == pvVar5) {
      apcStack_a08[0] = (code *)0x13ac43;
      test_iter_cold_3();
      goto LAB_0013ac43;
    }
  }
  apcStack_a08[0] = test_bcon_new;
  test_iter_cold_2();
  puVar18 = auStack_b80;
  pcStack_b88 = (code *)0x13ac7a;
  pvStack_a30 = pvVar6;
  puStack_a28 = puVar19;
  uStack_a20 = uVar12;
  pvStack_a18 = pvVar5;
  uStack_a10 = (ulong)uVar2;
  apcStack_a08[0] = (code *)apcStack_708;
  bson_init(auStack_b80);
  pcStack_b88 = (code *)0x13aca1;
  bson_append_utf8(auStack_b80,"hello",0xffffffff,"world",0xffffffff);
  pcStack_b88 = (code *)0x13acb2;
  uVar12 = bcon_new(0,"hello","world",0);
  pcStack_b88 = (code *)0x13acbd;
  pvVar5 = (void *)bson_get_data(uVar12);
  pcStack_b88 = (code *)0x13acc8;
  pvVar6 = (void *)bson_get_data(auStack_b80);
  if (uStack_b7c == *(uint *)(uVar12 + 4)) {
    pcStack_b88 = (code *)0x13ace1;
    pvVar7 = (void *)bson_get_data(auStack_b80);
    pcStack_b88 = (code *)0x13acec;
    pvVar8 = (void *)bson_get_data(uVar12);
    pcStack_b88 = (code *)0x13acfc;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_b7c);
    if (iVar1 == 0) {
      pcStack_b88 = (code *)0x13ad08;
      bson_destroy(uVar12);
      pcStack_b88 = (code *)0x13ad10;
      bson_destroy(auStack_b80);
      return;
    }
  }
  pcStack_b88 = (code *)0x13ad29;
  uVar9 = bson_as_canonical_extended_json(uVar12,0);
  pcStack_b88 = (code *)0x13ad39;
  uVar10 = bson_as_canonical_extended_json(auStack_b80,0);
  uVar2 = *(uint *)(uVar12 + 4);
  uVar3 = uStack_b7c;
  if (uVar2 < uStack_b7c) {
    uVar3 = uVar2;
  }
  if (uVar3 != 0) {
    uVar3 = uStack_b7c;
    if (uVar2 <= uStack_b7c) {
      uVar3 = uVar2;
    }
    lVar14 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar14) != *(char *)((long)pvVar6 + lVar14)) {
        uVar3 = (uint)lVar14;
        goto LAB_0013ad71;
      }
      lVar14 = lVar14 + 1;
    } while (uVar3 != (uint)lVar14);
  }
  uVar3 = 0xffffffff;
LAB_0013ad71:
  if (uVar2 < uStack_b7c) {
    uVar2 = uStack_b7c;
  }
  uVar2 = uVar2 - 1;
  if (uVar3 != 0xffffffff) {
    uVar2 = uVar3;
  }
  pcStack_b88 = (code *)0x13ad9c;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar2,uVar9,uVar10);
  pcStack_b88 = (code *)0x13adb4;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcStack_b88 = (code *)0x13adcf;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013ae17:
    pcStack_b88 = (code *)0x13ae1c;
    test_bcon_new_cold_5();
LAB_0013ae1c:
    pcStack_b88 = (code *)0x13ae21;
    test_bcon_new_cold_4();
LAB_0013ae21:
    pcStack_b88 = (code *)0x13ae26;
    test_bcon_new_cold_1();
  }
  else {
    puVar18 = (undefined1 *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013ae1c;
    uVar12 = (ulong)*(uint *)(uVar12 + 4);
    pcStack_b88 = (code *)0x13adef;
    uVar15 = write(uVar2,pvVar5,uVar12);
    if (uVar15 != uVar12) goto LAB_0013ae21;
    uVar12 = (ulong)uStack_b7c;
    pcStack_b88 = (code *)0x13ae07;
    uVar15 = write(uVar3,pvVar6,uVar12);
    if (uVar15 == uVar12) {
      pcStack_b88 = (code *)0x13ae17;
      test_bcon_new_cold_3();
      goto LAB_0013ae17;
    }
  }
  pcStack_b88 = test_append_ctx;
  test_bcon_new_cold_2();
  pbVar20 = &bStack_e00;
  pcStack_e08 = (code *)0x13ae4b;
  pvStack_bb0 = pvVar6;
  uStack_ba8 = (ulong)uVar2;
  puStack_ba0 = puVar18;
  uStack_b98 = uVar12;
  pvStack_b90 = pvVar5;
  pcStack_b88 = (code *)apcStack_a08;
  bson_init(&bStack_e00);
  pcStack_e08 = (code *)0x13ae5b;
  bson_init(auStack_d80);
  pcStack_e08 = (code *)0x13ae6b;
  bson_init(auStack_d00);
  pcStack_e08 = (code *)0x13ae8c;
  bson_append_utf8(auStack_d00,"c",0xffffffff,"d",0xffffffff);
  pcStack_e08 = (code *)0x13aeb3;
  bson_append_utf8(auStack_d00,"e",0xffffffff,"f",0xffffffff);
  pcStack_e08 = (code *)0x13aecd;
  bson_append_document(auStack_d80,"a",0xffffffff,auStack_d00);
  pcVar17 = "e";
  pcStack_e10 = (char *)0x0;
  pcStack_e18 = "}";
  pcStack_e20 = "f";
  pvStack_e28 = (void *)0x13af02;
  test_append_ctx_helper(&bStack_e00,"a","{",0,"add magic");
  pcStack_e08 = (code *)0x13af11;
  pvVar5 = (void *)bson_get_data(&bStack_e00);
  pcStack_e08 = (code *)0x13af1c;
  pvVar6 = (void *)bson_get_data(auStack_d80);
  if (uStack_d7c == bStack_e00.len) {
    pcStack_e08 = (code *)0x13af3a;
    pvVar7 = (void *)bson_get_data(auStack_d80);
    pcStack_e08 = (code *)0x13af45;
    pvVar8 = (void *)bson_get_data(&bStack_e00);
    pcStack_e08 = (code *)0x13af54;
    iVar1 = bcmp(pvVar7,pvVar8,(ulong)uStack_d7c);
    if (iVar1 == 0) {
      pcStack_e08 = (code *)0x13af60;
      bson_destroy(&bStack_e00);
      pcStack_e08 = (code *)0x13af6d;
      bson_destroy(auStack_d80);
      pcStack_e08 = (code *)0x13af7a;
      bson_destroy(auStack_d00);
      return;
    }
  }
  pcStack_e08 = (code *)0x13af96;
  uVar9 = bson_as_canonical_extended_json(&bStack_e00,0);
  pcStack_e08 = (code *)0x13afab;
  uVar10 = bson_as_canonical_extended_json(auStack_d80,0);
  uVar13 = uStack_d7c;
  if (bStack_e00.len < uStack_d7c) {
    uVar13 = bStack_e00.len;
  }
  if (uVar13 != 0) {
    uVar13 = uStack_d7c;
    if (bStack_e00.len <= uStack_d7c) {
      uVar13 = bStack_e00.len;
    }
    lVar14 = 0;
    do {
      if (*(char *)((long)pvVar5 + lVar14) != *(char *)((long)pvVar6 + lVar14)) {
        uVar2 = (uint)lVar14;
        goto LAB_0013afe4;
      }
      lVar14 = lVar14 + 1;
    } while (uVar13 != (uint)lVar14);
  }
  uVar2 = 0xffffffff;
LAB_0013afe4:
  uVar3 = bStack_e00.len;
  if (bStack_e00.len < uStack_d7c) {
    uVar3 = uStack_d7c;
  }
  uVar3 = uVar3 - 1;
  if (uVar2 != 0xffffffff) {
    uVar3 = uVar2;
  }
  pcStack_e08 = (code *)0x13b00f;
  uVar21 = extraout_XMM1_Qa;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",(ulong)uVar3);
  pcStack_e08 = (code *)0x13b027;
  uVar2 = open("failure.bad.bson",0x42,0x1a0);
  pcVar16 = "failure.expected.bson";
  pvVar7 = (void *)0x42;
  pcStack_e08 = (code *)0x13b042;
  uVar3 = open("failure.expected.bson",0x42,0x1a0);
  if (uVar2 == 0xffffffff) {
LAB_0013b08e:
    pcStack_e08 = (code *)0x13b093;
    test_append_ctx_cold_5();
LAB_0013b093:
    pcStack_e08 = (code *)0x13b098;
    test_append_ctx_cold_4();
  }
  else {
    pbVar20 = (bson_t *)(ulong)uVar3;
    if (uVar3 == 0xffffffff) goto LAB_0013b093;
    pcVar16 = (char *)(ulong)uVar2;
    pcStack_e08 = (code *)0x13b063;
    pvVar7 = pvVar5;
    uVar12 = write(uVar2,pvVar5,(ulong)bStack_e00.len);
    if (uVar12 == bStack_e00.len) {
      pvVar5 = (void *)(ulong)uStack_d7c;
      pcStack_e08 = (code *)0x13b07e;
      pvVar7 = pvVar6;
      pcVar16 = (char *)pbVar20;
      pvVar8 = (void *)write(uVar3,pvVar6,(size_t)pvVar5);
      if (pvVar8 != pvVar5) goto LAB_0013b09d;
      pvVar7 = (void *)(ulong)uVar3;
      pcStack_e08 = (code *)0x13b08e;
      pcVar16 = (char *)(ulong)uVar2;
      test_append_ctx_cold_3();
      goto LAB_0013b08e;
    }
  }
  pcStack_e08 = (code *)0x13b09d;
  test_append_ctx_cold_1();
LAB_0013b09d:
  pcStack_e08 = test_append_ctx_helper;
  test_append_ctx_cold_2();
  puStack_7440 = auStack_7430;
  if (extraout_AL != '\0') {
    uStack_73f0 = uVar21;
  }
  pvStack_7428 = pvVar7;
  uStack_7418 = uVar9;
  uStack_7410 = uVar10;
  pcStack_7408 = pcVar17;
  pvStack_e28 = pvVar6;
  pcStack_e20 = (char *)pbVar20;
  pcStack_e18 = (char *)pvVar5;
  pcStack_e10 = (char *)(ulong)uVar2;
  pcStack_e08 = (code *)&pcStack_b88;
  bcon_append_ctx_init(auStack_7380);
  puStack_7448 = bStack_e00.padding;
  uStack_7450 = 0x3000000008;
  bcon_append_ctx_va(pcVar16,auStack_7380,&uStack_7450);
  if ((uint)uStack_7450 < 0x29) {
    uStack_7450 = CONCAT44(uStack_7450._4_4_,(uint)uStack_7450 + 8);
  }
  else {
    puStack_7448 = puStack_7448 + 8;
  }
  bcon_append_ctx(pcVar16,auStack_7380,"c","d",0);
  bcon_append_ctx_va(pcVar16,auStack_7380,&uStack_7450);
  return;
}

Assistant:

static void
test_inline_nested (void)
{
   bson_t bcon, expected, foo, bar, third;

   bson_init (&bcon);
   bson_init (&expected);
   bson_init (&foo);
   bson_init (&bar);
   bson_init (&third);

   bson_append_utf8 (&third, "hello", -1, "world", -1);
   bson_append_int32 (&bar, "0", -1, 1);
   bson_append_int32 (&bar, "1", -1, 2);
   bson_append_document (&bar, "2", -1, &third);
   bson_append_array (&foo, "bar", -1, &bar);
   bson_append_document (&expected, "foo", -1, &foo);

   BCON_APPEND (&bcon,
                "foo",
                "{",
                "bar",
                "[",
                BCON_INT32 (1),
                BCON_INT32 (2),
                "{",
                "hello",
                "world",
                "}",
                "]",
                "}");

   bson_eq_bson (&bcon, &expected);

   bson_destroy (&bcon);
   bson_destroy (&expected);
   bson_destroy (&foo);
   bson_destroy (&bar);
   bson_destroy (&third);
}